

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_literals.cpp
# Opt level: O0

spv_result_t spvtools::val::LiteralsPass(ValidationState_t *_,Instruction *inst)

{
  spv_parsed_operand_t *psVar1;
  bool bVar2;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this;
  spv_parsed_operand_t *psVar3;
  DiagnosticStream *pDVar4;
  uint32_t local_224;
  DiagnosticStream local_220;
  undefined1 local_45;
  uint local_44;
  uint uStack_40;
  bool signedness;
  uint32_t remaining_value_bits;
  uint32_t bit_width;
  uint32_t word_size;
  uint32_t upper_word;
  int last_index;
  spv_parsed_operand_t *operand;
  size_t i;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  operand = (spv_parsed_operand_t *)0x0;
  i = (size_t)inst;
  inst_local = (Instruction *)_;
  do {
    psVar1 = operand;
    this = Instruction::operands((Instruction *)i);
    psVar3 = (spv_parsed_operand_t *)
             std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(this);
    if (psVar3 <= psVar1) {
      return SPV_SUCCESS;
    }
    _upper_word = Instruction::operand((Instruction *)i,(size_t)operand);
    bVar2 = anon_unknown_2::IsLiteralNumber(_upper_word);
    if (bVar2) {
      word_size = ((uint)_upper_word->offset + (uint)_upper_word->num_words) - 1;
      bit_width = Instruction::word((Instruction *)i,(long)(int)word_size);
      remaining_value_bits = 0x20;
      uStack_40 = _upper_word->number_bit_width;
      local_44 = uStack_40 & 0x1f;
      if (local_44 != 0) {
        local_45 = _upper_word->number_kind == SPV_NUMBER_SIGNED_INT;
        bVar2 = anon_unknown_2::VerifyUpperBits(bit_width,local_44,(bool)local_45);
        if (!bVar2) {
          ValidationState_t::diag
                    (&local_220,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_VALUE,
                     (Instruction *)i);
          pDVar4 = DiagnosticStream::operator<<
                             (&local_220,
                              (char (*) [61])
                              "The high-order bits of a literal number in instruction <id> ");
          local_224 = Instruction::id((Instruction *)i);
          pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_224);
          pDVar4 = DiagnosticStream::operator<<
                             (pDVar4,(char (*) [39])" must be 0 for a floating-point type, ");
          pDVar4 = DiagnosticStream::operator<<
                             (pDVar4,(char (*) [48])
                                     "or 0 for an integer type with Signedness of 0, ");
          pDVar4 = DiagnosticStream::operator<<
                             (pDVar4,(char (*) [38])"or sign extended when Signedness is 1");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
          DiagnosticStream::~DiagnosticStream(&local_220);
          return __local._4_4_;
        }
      }
    }
    operand = (spv_parsed_operand_t *)((long)&operand->offset + 1);
  } while( true );
}

Assistant:

spv_result_t LiteralsPass(ValidationState_t& _, const Instruction* inst) {
  // For every operand that is a literal number
  for (size_t i = 0; i < inst->operands().size(); i++) {
    const spv_parsed_operand_t& operand = inst->operand(i);
    if (!IsLiteralNumber(operand)) continue;

    // The upper bits are always in the last word (little-endian)
    int last_index = operand.offset + operand.num_words - 1;
    const uint32_t upper_word = inst->word(last_index);

    // TODO(jcaraban): is the |word size| defined in some header?
    const uint32_t word_size = 32;
    uint32_t bit_width = operand.number_bit_width;

    // Bit widths that are a multiple of the word size have no upper bits
    const auto remaining_value_bits = bit_width % word_size;
    if (remaining_value_bits == 0) continue;

    const bool signedness = operand.number_kind == SPV_NUMBER_SIGNED_INT;

    if (!VerifyUpperBits(upper_word, remaining_value_bits, signedness)) {
      return _.diag(SPV_ERROR_INVALID_VALUE, inst)
             << "The high-order bits of a literal number in instruction <id> "
             << inst->id() << " must be 0 for a floating-point type, "
             << "or 0 for an integer type with Signedness of 0, "
             << "or sign extended when Signedness is 1";
    }
  }
  return SPV_SUCCESS;
}